

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_record.cc
# Opt level: O1

bool bssl::do_seal_record
               (SSL *ssl,uint8_t *out_prefix,uint8_t *out,uint8_t *out_suffix,uint8_t type,
               uint8_t *in,size_t in_len)

{
  uint64_t *puVar1;
  SSLAEADContext *this;
  uint64_t seqnum;
  Span<const_unsigned_char> header;
  bool bVar2;
  bool bVar3;
  uint16_t uVar4;
  ushort record_version;
  size_t sVar5;
  uint8_t uVar6;
  int reason;
  uintptr_t b_u_1;
  int line;
  ulong uVar7;
  size_t extra_in_len;
  Span<const_unsigned_char> in_00;
  uintptr_t b_u_2;
  uintptr_t a_u;
  uintptr_t b_u;
  size_t ciphertext_len;
  size_t suffix_len;
  uint8_t local_71;
  uint8_t *local_70;
  uint8_t *local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  ushort local_50 [4];
  size_t local_48;
  uint8_t *local_40;
  undefined8 uStack_38;
  
  this = (ssl->s3->aead_write_ctx)._M_t.
         super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl;
  bVar3 = true;
  local_71 = type;
  local_70 = out_suffix;
  local_68 = in;
  local_60 = out;
  if (this->cipher_ == (SSL_CIPHER *)0x0) {
    extra_in_len = 0;
    local_58 = (uint8_t *)0x0;
  }
  else {
    uVar4 = ssl_protocol_version(ssl);
    extra_in_len = 0;
    local_58 = (uint8_t *)0x0;
    if (0x303 < uVar4) {
      local_58 = &local_71;
      extra_in_len = 1;
      bVar3 = false;
    }
  }
  bVar2 = SSLAEADContext::SuffixLen(this,&local_48,in_len,extra_in_len);
  if ((bVar2) &&
     (bVar2 = SSLAEADContext::CiphertextLen(this,(size_t *)local_50,in_len,extra_in_len), bVar2)) {
    if ((local_68 != local_60) && (local_68 < local_60 + in_len && local_60 < local_68 + in_len)) {
      __assert_fail("in == out || !buffers_alias(in, in_len, out, in_len)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x11a,
                    "bool bssl::do_seal_record(SSL *, uint8_t *, uint8_t *, uint8_t *, uint8_t, const uint8_t *, const size_t)"
                   );
    }
    sVar5 = ssl_record_prefix_len(ssl);
    if ((out_prefix < local_68 + in_len) && (local_68 < out_prefix + sVar5)) {
      __assert_fail("!buffers_alias(in, in_len, out_prefix, ssl_record_prefix_len(ssl))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x11b,
                    "bool bssl::do_seal_record(SSL *, uint8_t *, uint8_t *, uint8_t *, uint8_t, const uint8_t *, const size_t)"
                   );
    }
    if ((local_70 < local_68 + in_len) && (local_68 < local_70 + local_48)) {
      __assert_fail("!buffers_alias(in, in_len, out_suffix, suffix_len)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                    ,0x11c,
                    "bool bssl::do_seal_record(SSL *, uint8_t *, uint8_t *, uint8_t *, uint8_t, const uint8_t *, const size_t)"
                   );
    }
    uVar6 = '\x17';
    if (bVar3) {
      uVar6 = local_71;
    }
    *out_prefix = uVar6;
    if (ssl->s3->version == 0) {
      record_version = 0x301;
    }
    else {
      uVar4 = ssl_protocol_version(ssl);
      record_version = 0x303;
      if (uVar4 < 0x304) {
        record_version = ssl->s3->version;
      }
    }
    *(ushort *)(out_prefix + 1) = record_version << 8 | record_version >> 8;
    *(ushort *)(out_prefix + 3) = local_50[0] << 8 | local_50[0] >> 8;
    seqnum = ssl->s3->write_sequence;
    if (seqnum != 0xffffffffffffffff) {
      uStack_38 = 5;
      uVar7 = (ulong)record_version;
      header.size_ = 5;
      header.data_ = out_prefix;
      local_40 = out_prefix;
      bVar3 = SSLAEADContext::SealScatter
                        (this,out_prefix + 5,local_60,local_70,*out_prefix,record_version,seqnum,
                         header,local_68,in_len,local_58,extra_in_len);
      if (bVar3) {
        puVar1 = &ssl->s3->write_sequence;
        *puVar1 = *puVar1 + 1;
        in_00.size_ = uVar7;
        in_00.data_ = &DAT_00000005;
        ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x100,(int)out_prefix,in_00);
        return true;
      }
      return false;
    }
    reason = 0x45;
    line = 0x12d;
  }
  else {
    reason = 200;
    line = 0x116;
  }
  ERR_put_error(0x10,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_record.cc"
                ,line);
  return false;
}

Assistant:

static bool do_seal_record(SSL *ssl, uint8_t *out_prefix, uint8_t *out,
                           uint8_t *out_suffix, uint8_t type, const uint8_t *in,
                           const size_t in_len) {
  SSLAEADContext *aead = ssl->s3->aead_write_ctx.get();
  uint8_t *extra_in = NULL;
  size_t extra_in_len = 0;
  if (!aead->is_null_cipher() && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    // TLS 1.3 hides the actual record type inside the encrypted data.
    extra_in = &type;
    extra_in_len = 1;
  }

  size_t suffix_len, ciphertext_len;
  if (!aead->SuffixLen(&suffix_len, in_len, extra_in_len) ||
      !aead->CiphertextLen(&ciphertext_len, in_len, extra_in_len)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return false;
  }

  assert(in == out || !buffers_alias(in, in_len, out, in_len));
  assert(!buffers_alias(in, in_len, out_prefix, ssl_record_prefix_len(ssl)));
  assert(!buffers_alias(in, in_len, out_suffix, suffix_len));

  if (extra_in_len) {
    out_prefix[0] = SSL3_RT_APPLICATION_DATA;
  } else {
    out_prefix[0] = type;
  }

  uint16_t record_version = tls_record_version(ssl);
  out_prefix[1] = record_version >> 8;
  out_prefix[2] = record_version & 0xff;
  out_prefix[3] = ciphertext_len >> 8;
  out_prefix[4] = ciphertext_len & 0xff;
  Span<const uint8_t> header = Span(out_prefix, SSL3_RT_HEADER_LENGTH);

  // Ensure the sequence number update does not overflow.
  if (ssl->s3->write_sequence + 1 == 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }

  if (!aead->SealScatter(out_prefix + SSL3_RT_HEADER_LENGTH, out, out_suffix,
                         out_prefix[0], record_version, ssl->s3->write_sequence,
                         header, in, in_len, extra_in, extra_in_len)) {
    return false;
  }

  ssl->s3->write_sequence++;
  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HEADER, header);
  return true;
}